

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcess::~MultiAgentDecisionProcess(MultiAgentDecisionProcess *this,void **vtt)

{
  NamedDescribedEntity *in_RSI;
  long *in_RDI;
  vector<Agent,_std::allocator<Agent>_> *unaff_retaddr;
  
  *in_RDI = (long)in_RSI->_vptr_NamedDescribedEntity;
  *(undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x40)) = *(undefined8 *)&in_RSI->_m_name;
  std::__cxx11::string::clear();
  std::__cxx11::string::~string((string *)(in_RDI + 0x15));
  std::__cxx11::string::~string((string *)(in_RDI + 0x11));
  Scope::~Scope((Scope *)0xaa2cfa);
  std::vector<Agent,_std::allocator<Agent>_>::~vector(unaff_retaddr);
  NamedDescribedEntity::~NamedDescribedEntity(in_RSI);
  return;
}

Assistant:

MultiAgentDecisionProcess::~MultiAgentDecisionProcess()
{
    _m_problemFile.clear();
}